

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> * __thiscall
despot::BaseRockSample::ComputeOptimalSamplingPolicy(BaseRockSample *this)

{
  allocator<despot::ValuedAction> *this_00;
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  clock_t cVar9;
  double dVar10;
  double dVar11;
  int local_bc;
  int s_3;
  double v;
  ACT_TYPE a_1;
  int s_2;
  double diff;
  int iter;
  int a;
  int s_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  transition;
  undefined1 local_70 [8];
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  clock_t start;
  int s;
  allocator<despot::ValuedAction> local_39;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_38;
  int local_1c;
  BaseRockSample *pBStack_18;
  int num_states;
  BaseRockSample *this_local;
  
  pBStack_18 = this;
  local_1c = (**(code **)(*(long *)this + 0x10))();
  sVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::size
                    (&this->mdp_policy_);
  if (sVar3 == (long)local_1c) {
    this_local = (BaseRockSample *)&this->mdp_policy_;
  }
  else {
    sVar3 = (size_type)local_1c;
    std::allocator<despot::ValuedAction>::allocator(&local_39);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              (&local_38,sVar3,&local_39);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
              (&this->mdp_policy_,&local_38);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~vector(&local_38);
    std::allocator<despot::ValuedAction>::~allocator(&local_39);
    for (start._0_4_ = 0; (int)start < local_1c; start._0_4_ = (int)start + 1) {
      pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                         (&this->mdp_policy_,(long)(int)start);
      *(undefined8 *)(pvVar4 + 8) = 0;
    }
    next_policy.super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)clock();
    std::operator<<((ostream *)&std::cerr,"Computing optimal MDP policy...");
    sVar3 = (size_type)local_1c;
    this_00 = (allocator<despot::ValuedAction> *)
              ((long)&transition.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<despot::ValuedAction>::allocator(this_00);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_70,sVar3
               ,this_00);
    std::allocator<despot::ValuedAction>::~allocator
              ((allocator<despot::ValuedAction> *)
               ((long)&transition.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar3 = (size_type)local_1c;
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 3));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&s_1,sVar3,(allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 3));
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&a + 3));
    for (iter = 0; iter < local_1c; iter = iter + 1) {
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&s_1,(long)iter);
      std::vector<int,_std::allocator<int>_>::resize(pvVar5,5);
      for (diff._4_4_ = 0; diff._4_4_ < 5; diff._4_4_ = diff._4_4_ + 1) {
        iVar2 = NextState(this,iter,diff._4_4_);
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)&s_1,(long)iter);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)diff._4_4_);
        *pvVar6 = iVar2;
      }
    }
    diff._0_4_ = 0;
    do {
      for (v._4_4_ = 0; v._4_4_ < local_1c; v._4_4_ = v._4_4_ + 1) {
        pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                            local_70,(long)v._4_4_);
        *(undefined4 *)pvVar4 = 0xffffffff;
        uVar1 = Globals::NEG_INFTY;
        pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                            local_70,(long)v._4_4_);
        *(undefined8 *)(pvVar4 + 8) = uVar1;
        for (v._0_4_ = 0; v._0_4_ < 5; v._0_4_ = v._0_4_ + 1) {
          dVar10 = (double)(**(code **)(*(long *)this + 0x28))(this,v._4_4_,v._0_4_);
          dVar11 = Globals::Discount();
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&s_1,(long)v._4_4_);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)v._0_4_);
          pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                   operator[](&this->mdp_policy_,(long)*pvVar6);
          dVar10 = dVar11 * *(double *)(pvVar4 + 8) + dVar10;
          pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                   operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *
                              )local_70,(long)v._4_4_);
          if (*(double *)(pvVar4 + 8) <= dVar10 && dVar10 != *(double *)(pvVar4 + 8)) {
            pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                     operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                 *)local_70,(long)v._4_4_);
            *(double *)(pvVar4 + 8) = dVar10;
            pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                     operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                 *)local_70,(long)v._4_4_);
            *(int *)pvVar4 = v._0_4_;
          }
        }
      }
      _a_1 = 0.0;
      for (local_bc = 0; local_bc < local_1c; local_bc = local_bc + 1) {
        pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                            local_70,(long)local_bc);
        dVar11 = *(double *)(pvVar4 + 8);
        pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[](&this->mdp_policy_,(long)local_bc);
        _a_1 = ABS(dVar11 - *(double *)(pvVar4 + 8)) + _a_1;
        pvVar4 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[]((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                            local_70,(long)local_bc);
        pvVar7 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::
                 operator[](&this->mdp_policy_,(long)local_bc);
        *(undefined8 *)pvVar7 = *(undefined8 *)pvVar4;
        *(undefined8 *)(pvVar7 + 8) = *(undefined8 *)(pvVar4 + 8);
      }
      diff._0_4_ = diff._0_4_ + 1;
    } while (0.001 <= _a_1);
    poVar8 = std::operator<<((ostream *)&std::cerr,"Done [");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,diff._0_4_);
    poVar8 = std::operator<<(poVar8," iters, tol = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,_a_1);
    poVar8 = std::operator<<(poVar8,", ");
    cVar9 = clock();
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(double)(cVar9 - (long)next_policy.
                                                                                                            
                                                  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       ) / 1000000.0);
    poVar8 = std::operator<<(poVar8,"s]!");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    this_local = (BaseRockSample *)&this->mdp_policy_;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&s_1);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~vector
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_70);
  }
  return (vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)this_local;
}

Assistant:

vector<ValuedAction>& BaseRockSample::ComputeOptimalSamplingPolicy() const {
	int num_states = NumStates();
	if (mdp_policy_.size() == num_states)
		return mdp_policy_;

	mdp_policy_ = vector<ValuedAction>(num_states);
	for (int s = 0; s < num_states; s++) {
		mdp_policy_[s].value = 0;
	}

	clock_t start = clock();
	cerr << "Computing optimal MDP policy...";
	vector<ValuedAction> next_policy = vector<ValuedAction>(num_states);
	// Using precomputed transition saves around 60% of the time
	vector<vector<int> > transition = vector<vector<int> >(num_states);
	for (int s = 0; s < num_states; s++) {
		transition[s].resize(E_SAMPLE + 1);
		for (int a = 0; a <= E_SAMPLE; a++) // Sensing actions not needed
			transition[s][a] = NextState(s, a);
	}

	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < num_states; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a <= E_SAMPLE; a++) {
				double v = Reward(s, a)
					+ Globals::Discount() * mdp_policy_[transition[s][a]].value;

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < num_states; s++) {
			diff += fabs(next_policy[s].value - mdp_policy_[s].value);
			mdp_policy_[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}
	cerr << "Done [" << iter << " iters, tol = " << diff << ", "
		<< (double) (clock() - start) / CLOCKS_PER_SEC << "s]!" << endl;

	return mdp_policy_;
}